

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O0

Iterator * __thiscall
wasm::
SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
::Iterator::operator++(Iterator *this)

{
  bool *this_00;
  bool bVar1;
  T elem;
  Iterator __end0;
  Iterator __begin0;
  SCC *__range3;
  Iterator *this_local;
  
  __begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = operator*(this);
  this_00 = &__begin0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
  SCC::begin((Iterator *)
             &__end0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_engaged,(SCC *)this_00);
  SCC::end((Iterator *)&elem,(SCC *)this_00);
  while( true ) {
    bVar1 = SCC::Iterator::operator!=
                      ((Iterator *)
                       &__end0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_engaged,(Iterator *)&elem);
    if (!bVar1) break;
    SCC::Iterator::operator*
              ((Iterator *)
               &__end0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged);
    SCC::Iterator::operator++
              ((Iterator *)
               &__end0.val.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged);
  }
  bVar1 = stepToNextGroup((this->scc).parent);
  if (!bVar1) {
    (this->scc).parent =
         (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
          *)0x0;
  }
  return this;
}

Assistant:

Iterator& operator++() {
      // Skip the rest of the current SCC, if for some reason it was not
      // consumed.
      for (auto elem : *(*this)) {
        (void)elem;
      }
      if (!scc.parent->stepToNextGroup()) {
        // We are at the end, so mark ourselves as such.
        scc.parent = nullptr;
      }
      return *this;
    }